

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O1

void slang::ast::SFormat::formatPattern
               (string *result,ConstantValue *arg,Type *type,FormatOptions *options,
               bool isStringLiteral)

{
  char *pcVar1;
  TypeVisitor visitor;
  long *local_280;
  size_type local_278;
  long local_270 [2];
  TypeVisitor local_260;
  
  local_260.abbreviated = options->zeroPad;
  pcVar1 = local_260.buffer.buf.store_;
  local_260.buffer.buf.super_buffer<char>.size_ = 0;
  local_260.buffer.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_260.buffer.buf.super_buffer<char>.capacity_ = 500;
  local_260.buffer.showColors = false;
  local_260.isStringLiteral = isStringLiteral;
  local_260.buffer.buf.super_buffer<char>.ptr_ = pcVar1;
  Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
            (&type->super_Symbol,&local_260,arg);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_260.buffer.buf.super_buffer<char>.ptr_,
             local_260.buffer.buf.super_buffer<char>.ptr_ +
             local_260.buffer.buf.super_buffer<char>.size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (result,(char *)local_280,local_278);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_260.buffer.buf.super_buffer<char>.ptr_ != pcVar1) {
    free(local_260.buffer.buf.super_buffer<char>.ptr_);
  }
  return;
}

Assistant:

void formatPattern(std::string& result, const ConstantValue& arg, const Type& type,
                   const FormatOptions& options, bool isStringLiteral) {
    TypeVisitor visitor(options.zeroPad, isStringLiteral);
    type.visit(visitor, arg);
    result += visitor.buffer.str();
}